

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::AddKel(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
         *this,TPZFMatrix<std::complex<long_double>_> *elmat,TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  int64_t iVar2;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
  *in_RDI;
  TPZEqnArray<std::complex<long_double>_> AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffff6f50;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffff6f58;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffff6f68;
  TPZFileEqnStorage<std::complex<long_double>_> *in_stack_ffffffffffff6f70;
  TPZVec<long> *in_stack_ffffffffffff6f78;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffff6f80;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffff6f88;
  TPZFrontNonSym<std::complex<long_double>_> *in_stack_ffffffffffff6f90;
  TPZEqnArray<std::complex<long_double>_> *local_28;
  long local_20;
  
  TPZFrontNonSym<std::complex<long_double>_>::AddKel
            (in_stack_ffffffffffff6f90,in_stack_ffffffffffff6f88,
             (TPZVec<long> *)in_stack_ffffffffffff6f80);
  EquationsToDecompose
            ((TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
              *)in_stack_ffffffffffff6f80,in_stack_ffffffffffff6f78,
             (int64_t *)in_stack_ffffffffffff6f70,(int64_t *)in_stack_ffffffffffff6f68);
  TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(in_stack_ffffffffffff6f80);
  if (local_20 <= (long)local_28) {
    TPZFrontNonSym<std::complex<long_double>_>::DecomposeEquations
              ((TPZFrontNonSym<std::complex<long_double>_> *)in_stack_ffffffffffff6f70,
               (int64_t)in_stack_ffffffffffff6f68,(int64_t)in_RDI,in_stack_ffffffffffff6f58);
    CheckCompress(in_RDI);
    TPZFileEqnStorage<std::complex<long_double>_>::AddEqnArray
              (in_stack_ffffffffffff6f70,in_stack_ffffffffffff6f68);
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    in_stack_ffffffffffff6f50 = local_28;
    if (local_28 == (TPZEqnArray<std::complex<long_double>_> *)(iVar2 + -1)) {
      TPZFileEqnStorage<std::complex<long_double>_>::FinishWriting
                ((TPZFileEqnStorage<std::complex<long_double>_> *)local_28);
      TPZFileEqnStorage<std::complex<long_double>_>::ReOpen
                ((TPZFileEqnStorage<std::complex<long_double>_> *)local_28);
      in_stack_ffffffffffff6f50 = local_28;
    }
  }
  DVar1 = TPZFront<std::complex<long_double>_>::GetDecomposeType
                    (&(in_RDI->fFront).super_TPZFront<std::complex<long_double>_>);
  (in_RDI->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = (char)DVar1;
  TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray(in_stack_ffffffffffff6f50);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex){
	
	// message #1.3 to fFront:TPZFront
	fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.NElements();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	int64_t mineq, maxeq;
	
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}